

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROCmActivityProfileController.cpp
# Opt level: O1

ChannelController *
anon_unknown.dwarf_5bdc63::make_controller(char *name,config_map_t *initial_cfg,Options *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ChannelController *this;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  ostream *this_00;
  pointer __dest;
  long *plVar7;
  config_map_t *pcVar8;
  char *pcVar9;
  mapped_type *pmVar10;
  info_map_t *metadata;
  size_type *psVar11;
  bool bVar12;
  size_type __dnew_4;
  size_type __dnew_3;
  string local_query;
  string cross_select;
  string format;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  services;
  string cross_query;
  string local_select;
  key_type local_328;
  Options *local_308;
  size_type local_300;
  key_type local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [20];
  uint uStack_264;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [14];
  ios_base local_140 [264];
  int local_38;
  
  local_308 = opts;
  this = (ChannelController *)operator_new(0x18);
  cali::services::get_available_services_abi_cxx11_();
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[10]>>
                    (local_278._0_8_,local_278._8_8_,"mpireport");
  bVar12 = _Var6._M_current !=
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._8_8_;
  bVar4 = cali::ConfigManager::Options::is_set(local_308,"aggregate_across_ranks");
  if (bVar4) {
    cali::ConfigManager::Options::get_abi_cxx11_(&local_2b8,local_308,"aggregate_across_ranks","");
    local_238._0_8_ = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,local_2b8._M_dataplus._M_p,
               local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
    bVar12 = cali::StringConverter::to_bool((StringConverter *)local_238,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._0_8_ != local_228) {
      operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar12 == true &&
      _Var6._M_current ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._8_8_) {
    this_00 = (ostream *)local_238;
    std::ofstream::ofstream(this_00);
    local_38 = 0;
    iVar5 = cali::Log::verbosity();
    if (local_38 <= iVar5) {
      this_00 = cali::Log::get_stream((Log *)local_238);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,
               "rocm-activity: cannot enable mpi support: mpireport service is not available.",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    local_238._0_8_ = _VTT;
    *(undefined8 *)(local_238 + *(long *)(_VTT->_M_local_buf + -0x18)) =
         ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_238 + 8));
    std::ios_base::~ios_base(local_140);
    bVar12 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  cali::ChannelController::ChannelController(this,name,0,initial_cfg);
  this->_vptr_ChannelController = (_func_int **)&PTR_on_create_0027c1d0;
  local_238._0_8_ = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,
             " inclusive_scale(sum#time.duration.ns,1e-9) as \"Host Time\",inclusive_scale(sum#rocm.activity.duration,1e-9) as \"GPU Time\",inclusive_ratio(sum#rocm.activity.duration,sum#time.duration.ns,100.0) as \"GPU %\""
             ,"");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_278._0_8_ = (pointer)0x130;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8,(ulong)local_278);
  uVar3 = local_278._0_8_;
  local_2b8.field_2._M_allocated_capacity = local_278._0_8_;
  local_2b8._M_dataplus._M_p = __dest;
  memcpy(__dest,
         " avg(iscale#sum#time.duration.ns) as \"Avg Host Time\",max(iscale#sum#time.duration.ns) as \"Max Host Time\",avg(iscale#sum#rocm.activity.duration) as \"Avg GPU Time\",max(iscale#sum#rocm.activity.duration) as \"Max GPU Time\",ratio(iscale#sum#rocm.activity.duration,iscale#sum#time.duration.ns,100.0) as \"GPU %\""
         ,0x130);
  local_2b8._M_string_length = uVar3;
  __dest[uVar3] = '\0';
  local_278._16_4_ = 0x68746170;
  local_278._8_8_ = (pointer)0x4;
  uStack_264 = uStack_264 & 0xffffff00;
  local_278._0_8_ = (pointer)(local_278 + 0x10);
  bVar4 = cali::ConfigManager::Options::is_enabled(local_308,"show_kernels");
  if (bVar4) {
    std::__cxx11::string::append(local_278);
    paVar1 = &local_2d8.field_2;
    local_258._M_allocated_capacity = 0x1b;
    local_2d8._M_dataplus._M_p = (pointer)paVar1;
    local_2d8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2d8,(ulong)&local_258);
    local_2d8.field_2._M_allocated_capacity = local_258._M_allocated_capacity;
    builtin_strncpy(local_2d8._M_dataplus._M_p,"rocm.kernel.name as Kernel,",0x1b);
    local_2d8._M_string_length = local_258._M_allocated_capacity;
    local_2d8._M_dataplus._M_p[local_258._M_allocated_capacity] = '\0';
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2d8,local_238._0_8_);
    paVar2 = &local_298.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_298.field_2._M_allocated_capacity = *psVar11;
      local_298.field_2._8_8_ = plVar7[3];
      local_298._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar11;
      local_298._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_298._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_238,(string *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    local_258._M_allocated_capacity = 0x1b;
    local_2d8._M_dataplus._M_p = (pointer)paVar1;
    local_2d8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2d8,(ulong)&local_258);
    local_2d8.field_2._M_allocated_capacity = local_258._M_allocated_capacity;
    builtin_strncpy(local_2d8._M_dataplus._M_p,"rocm.kernel.name as Kernel,",0x1b);
    local_2d8._M_string_length = local_258._M_allocated_capacity;
    local_2d8._M_dataplus._M_p[local_258._M_allocated_capacity] = '\0';
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2d8,(ulong)local_2b8._M_dataplus._M_p);
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_298.field_2._M_allocated_capacity = *psVar11;
      local_298.field_2._8_8_ = plVar7[3];
      local_298._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar11;
      local_298._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_298._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
  cali::util::build_tree_format_spec(&local_298,pcVar8,local_308,"");
  local_2d8._M_string_length = 7;
  local_2d8.field_2._M_allocated_capacity = 0x207463656c6573;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_append((char *)&local_2d8,local_238._0_8_);
  pcVar9 = (char *)std::__cxx11::string::append((char *)&local_2d8);
  std::__cxx11::string::_M_append(pcVar9,local_278._0_8_);
  pcVar9 = (char *)std::__cxx11::string::append((char *)&local_2d8);
  std::__cxx11::string::_M_append(pcVar9,(ulong)local_298._M_dataplus._M_p);
  local_248._M_allocated_capacity._0_4_ = 0x656c6573;
  local_258._8_8_ = 7;
  local_248._M_allocated_capacity._4_4_ = 0x207463;
  local_258._M_allocated_capacity = (size_type)&local_248;
  std::__cxx11::string::_M_append(local_258._M_local_buf,(ulong)local_2b8._M_dataplus._M_p);
  pcVar9 = (char *)std::__cxx11::string::append(local_258._M_local_buf);
  std::__cxx11::string::_M_append(pcVar9,local_278._0_8_);
  pcVar9 = (char *)std::__cxx11::string::append(local_258._M_local_buf);
  std::__cxx11::string::_M_append(pcVar9,(ulong)local_298._M_dataplus._M_p);
  if (bVar12 == false) {
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    paVar1 = &local_328.field_2;
    local_2f8._M_dataplus._M_p = (pointer)0x14;
    local_328._M_dataplus._M_p = (pointer)paVar1;
    local_328._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_2f8);
    local_328.field_2._M_allocated_capacity = (size_type)local_2f8._M_dataplus._M_p;
    builtin_strncpy(local_328._M_dataplus._M_p,"CALI_SERVICES_ENABLE",0x14);
    local_328._M_string_length = (size_type)local_2f8._M_dataplus._M_p;
    local_328._M_dataplus._M_p[(long)local_2f8._M_dataplus._M_p] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_328);
    std::__cxx11::string::append((char *)pmVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    cali::ConfigManager::Options::get_abi_cxx11_(&local_328,local_308,"output","stderr");
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    paVar2 = &local_2f8.field_2;
    local_300 = 0x14;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    local_2f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_300);
    local_2f8.field_2._M_allocated_capacity = local_300;
    builtin_strncpy(local_2f8._M_dataplus._M_p,"CALI_REPORT_FILENAME",0x14);
    local_2f8._M_string_length = local_300;
    local_2f8._M_dataplus._M_p[local_300] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    cali::ConfigManager::Options::get_abi_cxx11_(&local_328,local_308,"output.append","");
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    local_300 = 0x12;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    local_2f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_300);
    local_2f8.field_2._M_allocated_capacity = local_300;
    builtin_strncpy(local_2f8._M_dataplus._M_p,"CALI_REPORT_APPEND",0x12);
    local_2f8._M_string_length = local_300;
    local_2f8._M_dataplus._M_p[local_300] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    cali::ConfigManager::Options::build_query(&local_328,local_308,"local",&local_2d8);
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    local_300 = 0x12;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    local_2f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_300);
    local_2f8.field_2._M_allocated_capacity = local_300;
    builtin_strncpy(local_2f8._M_dataplus._M_p,"CALI_REPORT_CONFIG",0x12);
    local_2f8._M_string_length = local_300;
    local_2f8._M_dataplus._M_p[local_300] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_2f8);
  }
  else {
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    paVar1 = &local_328.field_2;
    local_2f8._M_dataplus._M_p = (pointer)0x14;
    local_328._M_dataplus._M_p = (pointer)paVar1;
    local_328._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_2f8);
    local_328.field_2._M_allocated_capacity = (size_type)local_2f8._M_dataplus._M_p;
    builtin_strncpy(local_328._M_dataplus._M_p,"CALI_SERVICES_ENABLE",0x14);
    local_328._M_string_length = (size_type)local_2f8._M_dataplus._M_p;
    local_328._M_dataplus._M_p[(long)local_2f8._M_dataplus._M_p] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_328);
    std::__cxx11::string::append((char *)pmVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    cali::ConfigManager::Options::get_abi_cxx11_(&local_328,local_308,"output","stderr");
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    paVar2 = &local_2f8.field_2;
    local_300 = 0x17;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    local_2f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_300);
    local_2f8.field_2._M_allocated_capacity = local_300;
    builtin_strncpy(local_2f8._M_dataplus._M_p,"CALI_MPIREPORT_FILENAME",0x17);
    local_2f8._M_string_length = local_300;
    local_2f8._M_dataplus._M_p[local_300] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    cali::ConfigManager::Options::get_abi_cxx11_(&local_328,local_308,"output.append","");
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    local_300 = 0x15;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    local_2f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_300);
    local_2f8.field_2._M_allocated_capacity = local_300;
    builtin_strncpy(local_2f8._M_dataplus._M_p,"CALI_MPIREPORT_APPEND",0x15);
    local_2f8._M_string_length = local_300;
    local_2f8._M_dataplus._M_p[local_300] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    local_2f8._M_dataplus._M_p = (pointer)0x20;
    local_328._M_dataplus._M_p = (pointer)paVar1;
    local_328._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_2f8);
    local_328.field_2._M_allocated_capacity = (size_type)local_2f8._M_dataplus._M_p;
    builtin_strncpy(local_328._M_dataplus._M_p,"CALI_MPIREPORT_WRITE_ON_FINALIZE",0x20);
    local_328._M_string_length = (size_type)local_2f8._M_dataplus._M_p;
    local_328._M_dataplus._M_p[(long)local_2f8._M_dataplus._M_p] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_328);
    std::__cxx11::string::_M_replace((ulong)pmVar10,0,(char *)pmVar10->_M_string_length,0x226b86);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    cali::ConfigManager::Options::build_query(&local_328,local_308,"local",&local_2d8);
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    local_300 = 0x1b;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    local_2f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_300);
    local_2f8.field_2._M_allocated_capacity = local_300;
    builtin_strncpy(local_2f8._M_dataplus._M_p,"CALI_MPIREPORT_LOCAL_CONFIG",0x1b);
    local_2f8._M_string_length = local_300;
    local_2f8._M_dataplus._M_p[local_300] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,
                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
    }
    cali::ConfigManager::Options::build_query(&local_328,local_308,"cross",(string *)&local_258);
    pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
    local_300 = 0x15;
    local_2f8._M_dataplus._M_p = (pointer)paVar2;
    local_2f8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_300);
    local_2f8.field_2._M_allocated_capacity = local_300;
    builtin_strncpy(local_2f8._M_dataplus._M_p,"CALI_MPIREPORT_CONFIG",0x15);
    local_2f8._M_string_length = local_300;
    local_2f8._M_dataplus._M_p[local_300] = '\0';
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pcVar8,&local_2f8);
  }
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,(ulong)(local_328.field_2._M_allocated_capacity + 1))
    ;
  }
  pcVar8 = cali::ChannelController::config_abi_cxx11_(this);
  cali::ConfigManager::Options::update_channel_config(local_308,pcVar8);
  metadata = cali::ChannelController::metadata_abi_cxx11_(this);
  cali::ConfigManager::Options::update_channel_metadata(local_308,metadata);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_allocated_capacity != &local_248) {
    operator_delete((void *)local_258._M_allocated_capacity,
                    CONCAT44(local_248._M_allocated_capacity._4_4_,
                             local_248._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_,CONCAT44(uStack_264,local_278._16_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

cali::ChannelController* make_controller(
    const char*                         name,
    const config_map_t&                 initial_cfg,
    const cali::ConfigManager::Options& opts
)
{
    std::string format = opts.get("output.format", "cali");

    if (format == "hatchet")
        format = "json-split";

    if (!(format == "json-split" || format == "json" || format == "cali")) {
        format = "cali";
        Log(0).stream() << "hatchet-region-profile: Unknown output format \"" << format << "\". Using json-split."
                        << std::endl;
    }

    return new RocmActivityProfileController(name, initial_cfg, opts, format);
}